

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O0

void __thiscall
Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,1,-1,1,1,-1>,1,-1,false>>::
visit<Eigen::internal::max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,1,_1,1,1,_1>,1,_1,false>,0>>
          (DenseBase<Eigen::Block<Eigen::Matrix<float,1,_1,1,1,_1>,1,_1,false>> *this,
          max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
          *visitor)

{
  Index IVar1;
  Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false> *xpr;
  undefined1 local_38 [8];
  ThisEvaluator thisEval;
  max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
  *visitor_local;
  DenseBase<Eigen::Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false>_> *this_local;
  
  thisEval.m_xpr = (Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false> *)visitor;
  IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false>_>
                      *)this);
  if (IVar1 != 0) {
    xpr = EigenBase<Eigen::Block<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::derived
                    ((EigenBase<Eigen::Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false>_>
                      *)this);
    internal::visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>
    ::visitor_evaluator((visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false>_>
                         *)local_38,xpr);
    internal::
    visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_1,_-1,_false>,_0>,_Eigen::internal::visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>,_-1>
    ::run((visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false>_> *)
          local_38,(max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
                    *)thisEval.m_xpr);
    internal::visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>
    ::~visitor_evaluator
              ((visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_1,__1,_false>_>
                *)local_38);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void DenseBase<Derived>::visit(Visitor& visitor) const
{
  if(size()==0)
    return;

  typedef typename internal::visitor_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  enum {
    unroll =  SizeAtCompileTime != Dynamic
           && SizeAtCompileTime * int(ThisEvaluator::CoeffReadCost) + (SizeAtCompileTime-1) * int(internal::functor_traits<Visitor>::Cost) <= EIGEN_UNROLLING_LIMIT
  };
  return internal::visitor_impl<Visitor, ThisEvaluator, unroll ? int(SizeAtCompileTime) : Dynamic>::run(thisEval, visitor);
}